

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void * mpc_malloc(mpc_input_t *i,size_t n)

{
  size_t sVar1;
  char *p;
  size_t j;
  size_t n_local;
  mpc_input_t *i_local;
  
  if (n < 0x41) {
    sVar1 = i->mem_index;
    do {
      if (i->mem_full[i->mem_index] == '\0') {
        sVar1 = i->mem_index;
        i->mem_full[i->mem_index] = '\x01';
        i->mem_index = i->mem_index + 1 & 0x1ff;
        return i->mem + sVar1;
      }
      i->mem_index = i->mem_index + 1 & 0x1ff;
    } while (sVar1 != i->mem_index);
    i_local = (mpc_input_t *)malloc(n);
  }
  else {
    i_local = (mpc_input_t *)malloc(n);
  }
  return i_local;
}

Assistant:

static void *mpc_malloc(mpc_input_t *i, size_t n) {
  size_t j;
  char *p;

  if (n > sizeof(mpc_mem_t)) { return malloc(n); }

  j = i->mem_index;
  do {
    if (!i->mem_full[i->mem_index]) {
      p = (void*)(i->mem + i->mem_index);
      i->mem_full[i->mem_index] = 1;
      i->mem_index = (i->mem_index+1) % MPC_INPUT_MEM_NUM;
      return p;
    }
    i->mem_index = (i->mem_index+1) % MPC_INPUT_MEM_NUM;
  } while (j != i->mem_index);

  return malloc(n);
}